

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::NotILikeOperatorASCII,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  char *pdata;
  char *sdata;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  char *local_20;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pdVar2 = result->data;
  if (((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) {
    local_28 = *(ulong *)left->data;
    local_20 = *(char **)((long)left->data + 8);
    local_38 = *(ulong *)right->data;
    local_30 = *(char **)((long)right->data + 8);
    sdata = local_20;
    if ((local_28 & 0xffffffff) < 0xd) {
      sdata = (char *)((long)&local_28 + 4);
    }
    pdata = local_30;
    if ((local_38 & 0xffffffff) < 0xd) {
      pdata = (char *)((long)&local_38 + 4);
    }
    bVar3 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::ASCIILCaseReader>
                      (sdata,local_28 & 0xffffffff,pdata,local_38 & 0xffffffff,'\0');
    *pdVar2 = !bVar3;
    return;
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}